

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

int __thiscall
baryonyx::itm::compute_order::
local_compute_violated_constraints<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array>
          (compute_order *this,
          solver_random_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
          *slv,bit_array *x)

{
  bool bVar1;
  int iVar2;
  int k;
  int k_00;
  
  iVar2 = 0;
  for (k_00 = 0; k_00 != slv->m; k_00 = k_00 + 1) {
    bVar1 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>>,baryonyx::bit_array>
                      (slv,k_00,x);
    iVar2 = iVar2 + (uint)!bVar1;
  }
  return iVar2;
}

Assistant:

int local_compute_violated_constraints(const Solver& slv, const Xtype& x)
    {
        int remaining = 0;
        for (int k = 0; k != slv.m; ++k)
            if (!is_valid_constraint(slv, k, x))
                ++remaining;

        return remaining;
    }